

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mul-mat0.c
# Opt level: O0

int main(int argc,char **argv)

{
  ggml_tensor *x0;
  ggml_context *ctx0_00;
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  long lVar3;
  undefined8 uVar4;
  long in_RSI;
  int in_EDI;
  ggml_cgraph *gf_1;
  ggml_tensor *f_1;
  ggml_tensor *m_1;
  int ndims_1;
  int nargs_1;
  ggml_cgraph *gf;
  ggml_tensor *f;
  ggml_tensor *m;
  int ndims;
  int nargs;
  ggml_tensor *x [2];
  ggml_context *ctx0;
  int iter;
  int n_threads;
  char *env;
  int niter;
  int64_t ne [4];
  ggml_init_params params;
  int ndims_00;
  int64_t *dims;
  int64_t in_stack_ffffffffffffff08;
  int64_t *in_stack_ffffffffffffff10;
  ggml_context *in_stack_ffffffffffffff18;
  ggml_context *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  ggml_tensor *in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  ggml_context *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  int local_a0;
  uint uVar5;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffff90;
  uint uVar7;
  int iStack_44;
  int64_t *local_40;
  
  iStack_44 = 0;
  local_40 = (int64_t *)0x0;
  uVar7 = 500;
  x0 = (ggml_tensor *)getenv("GGML_NLOOP");
  if (x0 != (ggml_tensor *)0x0) {
    uVar7 = atoi((char *)x0);
  }
  if (1 < in_EDI) {
    uVar7 = atoi(*(char **)(in_RSI + 8));
  }
  uVar6 = 1;
  uVar5 = 0;
  do {
    if ((int)uVar7 <= (int)uVar5) {
      return 0;
    }
    printf("test-mul-mat0: iter:%d/%d\n",(ulong)uVar5,(ulong)uVar7);
    dims = local_40;
    ndims_00 = iStack_44;
    ctx0_00 = (ggml_context *)ggml_init();
    get_random_dims(dims,ndims_00);
    for (local_a0 = 2; local_a0 < 5; local_a0 = local_a0 + 1) {
      pgVar1 = get_random_tensor(in_stack_ffffffffffffff20,
                                 (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                                 in_stack_ffffffffffffff10,
                                 (float)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                                 (float)in_stack_ffffffffffffff08);
      rand();
      pgVar2 = get_random_tensor(in_stack_ffffffffffffff20,
                                 (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                                 in_stack_ffffffffffffff10,
                                 (float)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                                 (float)in_stack_ffffffffffffff08);
      ggml_set_param(ctx0_00,pgVar1);
      lVar3 = ggml_mul_mat(ctx0_00,pgVar2,pgVar1);
      in_stack_ffffffffffffff50 = (char *)ggml_sum(ctx0_00,lVar3);
      in_stack_ffffffffffffff08 = pgVar1->ne[3];
      printf("testing: mul_mat, [%ld, %ld, %ld, %ld] = [%ld, %ld, %ld, %ld] * [%ld, %ld, %ld, %ld]\n"
             ,*(undefined8 *)(lVar3 + 0x10),*(undefined8 *)(lVar3 + 0x18),
             *(undefined8 *)(lVar3 + 0x20),*(undefined8 *)(lVar3 + 0x28),pgVar2->ne[0],pgVar2->ne[1]
             ,pgVar2->ne[2],pgVar2->ne[3],pgVar1->ne[0],pgVar1->ne[1],pgVar1->ne[2]);
      if (*(long *)(lVar3 + 0x10) != pgVar2->ne[1]) {
        __assert_fail("m->ne[0] == x[1]->ne[1]",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat0.c"
                      ,0x117,"int main(int, const char **)");
      }
      if (*(long *)(lVar3 + 0x18) != pgVar1->ne[1]) {
        __assert_fail("m->ne[1] == x[0]->ne[1]",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat0.c"
                      ,0x118,"int main(int, const char **)");
      }
      if (*(long *)(lVar3 + 0x20) != pgVar1->ne[2]) {
        __assert_fail("m->ne[2] == x[0]->ne[2]",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat0.c"
                      ,0x119,"int main(int, const char **)");
      }
      if (*(long *)(lVar3 + 0x28) != pgVar1->ne[3]) {
        __assert_fail("m->ne[3] == x[0]->ne[3]",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat0.c"
                      ,0x11a,"int main(int, const char **)");
      }
      if (local_a0 < 3) {
        check_gradient(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                       (ggml_tensor **)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)
                       ,in_stack_ffffffffffffff38,(int)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                       (int)in_stack_ffffffffffffff30,
                       (float)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                       (float)in_stack_ffffffffffffff28,
                       (float)((ulong)in_stack_ffffffffffffff20 >> 0x20));
      }
      else {
        in_stack_ffffffffffffff48 = (ggml_context *)ggml_new_graph(ctx0_00);
        ggml_build_forward_expand(in_stack_ffffffffffffff48,lVar3);
        ggml_graph_compute_with_ctx(ctx0_00,in_stack_ffffffffffffff48,uVar6);
      }
      check_mat_mul((ggml_tensor *)CONCAT44(uVar7,in_stack_ffffffffffffff90),x0,
                    (ggml_tensor *)CONCAT44(uVar6,uVar5));
    }
    in_stack_ffffffffffffff44 = 1;
    for (in_stack_ffffffffffffff40 = 2; in_stack_ffffffffffffff40 < 5;
        in_stack_ffffffffffffff40 = in_stack_ffffffffffffff40 + 1) {
      pgVar1 = get_random_tensor(in_stack_ffffffffffffff20,
                                 (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                                 in_stack_ffffffffffffff10,
                                 (float)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                                 (float)in_stack_ffffffffffffff08);
      rand();
      in_stack_ffffffffffffff18 = ctx0_00;
      in_stack_ffffffffffffff20 = ctx0_00;
      pgVar2 = get_random_tensor(ctx0_00,(int)((ulong)ctx0_00 >> 0x20),in_stack_ffffffffffffff10,
                                 (float)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                                 (float)in_stack_ffffffffffffff08);
      uVar4 = ggml_transpose(in_stack_ffffffffffffff18,pgVar2);
      lVar3 = ggml_cont(in_stack_ffffffffffffff20,uVar4);
      ggml_set_param(ctx0_00,pgVar1);
      in_stack_ffffffffffffff38 = (ggml_tensor *)ggml_mul_mat(ctx0_00,lVar3,pgVar1);
      in_stack_ffffffffffffff30 = ggml_sum(ctx0_00,in_stack_ffffffffffffff38);
      in_stack_ffffffffffffff08 = pgVar1->ne[3];
      printf("testing: mul_mat, [%ld, %ld, %ld, %ld] = [%ld, %ld, %ld, %ld] * [%ld, %ld, %ld, %ld]\n"
             ,in_stack_ffffffffffffff38->ne[0],in_stack_ffffffffffffff38->ne[1],
             in_stack_ffffffffffffff38->ne[2],in_stack_ffffffffffffff38->ne[3],
             *(undefined8 *)(lVar3 + 0x10),*(undefined8 *)(lVar3 + 0x18),
             *(undefined8 *)(lVar3 + 0x20),*(undefined8 *)(lVar3 + 0x28),pgVar1->ne[0],pgVar1->ne[1]
             ,pgVar1->ne[2]);
      if (in_stack_ffffffffffffff38->ne[0] != *(long *)(lVar3 + 0x18)) {
        __assert_fail("m->ne[0] == x[1]->ne[1]",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat0.c"
                      ,0x13c,"int main(int, const char **)");
      }
      if (in_stack_ffffffffffffff38->ne[1] != pgVar1->ne[1]) {
        __assert_fail("m->ne[1] == x[0]->ne[1]",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat0.c"
                      ,0x13d,"int main(int, const char **)");
      }
      if (in_stack_ffffffffffffff38->ne[2] != pgVar1->ne[2]) {
        __assert_fail("m->ne[2] == x[0]->ne[2]",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat0.c"
                      ,0x13e,"int main(int, const char **)");
      }
      if (in_stack_ffffffffffffff38->ne[3] != pgVar1->ne[3]) {
        __assert_fail("m->ne[3] == x[0]->ne[3]",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat0.c"
                      ,0x13f,"int main(int, const char **)");
      }
      if (in_stack_ffffffffffffff40 < 3) {
        check_gradient(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                       (ggml_tensor **)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)
                       ,in_stack_ffffffffffffff38,(int)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                       (int)in_stack_ffffffffffffff30,
                       (float)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                       (float)in_stack_ffffffffffffff28,
                       (float)((ulong)in_stack_ffffffffffffff20 >> 0x20));
      }
      else {
        in_stack_ffffffffffffff28 = ggml_new_graph(ctx0_00);
        ggml_build_forward_expand(in_stack_ffffffffffffff28,in_stack_ffffffffffffff38);
        ggml_graph_compute_with_ctx(ctx0_00,in_stack_ffffffffffffff28,uVar6);
      }
      check_mat_mul((ggml_tensor *)CONCAT44(uVar7,in_stack_ffffffffffffff90),x0,
                    (ggml_tensor *)CONCAT44(uVar6,uVar5));
    }
    ggml_free(ctx0_00);
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

int main(int argc, const char ** argv) {
    struct ggml_init_params params = {
        .mem_size   = 128*1024*1024,
        .mem_buffer = NULL,
        .no_alloc   = false,
    };

    int64_t ne[4];

    // original loop: 500
    int niter = 500;
    const char *env = getenv("GGML_NLOOP");
    if (env != NULL) {
        niter = atoi(env);
    }
    if (argc > 1) {
        niter = atoi(argv[1]);
    }

    int n_threads = 1;

    for (int iter = 0; iter < niter; ++iter) {
        printf("test-mul-mat0: iter:%d/%d\n", iter, niter);
        struct ggml_context * ctx0 = ggml_init(params);

        get_random_dims(ne, 4);

        struct ggml_tensor * x[MAX_NARGS];

        // mul_mat
        {
            const int nargs = 1;

            for (int ndims = 2; ndims <= 4; ++ndims) {
                x[0] = get_random_tensor(ctx0, ndims, ne, -1.0f, 1.0f);
                ne[1] = rand()%4 + 1;
                x[1] = get_random_tensor(ctx0, ndims, ne, -1.0f, 1.0f);

                ggml_set_param(ctx0, x[0]);

                struct ggml_tensor * m = ggml_mul_mat(ctx0, x[1], x[0]);
                struct ggml_tensor * f = ggml_sum(ctx0, m);

                printf("testing: mul_mat, [%" PRId64 ", %" PRId64 ", %" PRId64 ", %" PRId64 "] = [%" PRId64 ", %" PRId64 ", %" PRId64 ", %" PRId64 "] * [%" PRId64 ", %" PRId64 ", %" PRId64 ", %" PRId64 "]\n",
                           m->ne[0],    m->ne[1],    m->ne[2],    m->ne[3],
                        x[1]->ne[0], x[1]->ne[1], x[1]->ne[2], x[1]->ne[3],
                        x[0]->ne[0], x[0]->ne[1], x[0]->ne[2], x[0]->ne[3]);

                assert(m->ne[0] == x[1]->ne[1]);
                assert(m->ne[1] == x[0]->ne[1]);
                assert(m->ne[2] == x[0]->ne[2]);
                assert(m->ne[3] == x[0]->ne[3]);

                if (ndims <= 2) {
                    check_gradient("mul_mat", ctx0, x, f, ndims, nargs, 1e-3f, 1e-3f, INFINITY);
                } else {
                    struct ggml_cgraph * gf = ggml_new_graph(ctx0);
                    ggml_build_forward_expand(gf, m);
                    ggml_graph_compute_with_ctx(ctx0, gf, n_threads);
                }

                check_mat_mul(m, x[1], x[0]);
            }
        }

        // mul_mat (transposed)
        {
            const int nargs = 1;

            for (int ndims = 2; ndims <= 4; ++ndims) {
                x[0] = get_random_tensor(ctx0, ndims, ne, -1.0f, 1.0f);
                ne[1] = ne[0];
                ne[0] = rand()%4 + 1;
                x[1] = ggml_cont(ctx0, ggml_transpose(ctx0, get_random_tensor(ctx0, ndims, ne, -1.0f, 1.0f)));

                ggml_set_param(ctx0, x[0]);

                struct ggml_tensor * m = ggml_mul_mat(ctx0, x[1], x[0]);
                struct ggml_tensor * f = ggml_sum(ctx0, m);

                printf("testing: mul_mat, [%" PRId64 ", %" PRId64 ", %" PRId64 ", %" PRId64 "] = [%" PRId64 ", %" PRId64 ", %" PRId64 ", %" PRId64 "] * [%" PRId64 ", %" PRId64 ", %" PRId64 ", %" PRId64 "]\n",
                           m->ne[0],    m->ne[1],    m->ne[2],    m->ne[3],
                        x[1]->ne[0], x[1]->ne[1], x[1]->ne[2], x[1]->ne[3],
                        x[0]->ne[0], x[0]->ne[1], x[0]->ne[2], x[0]->ne[3]);

                assert(m->ne[0] == x[1]->ne[1]);
                assert(m->ne[1] == x[0]->ne[1]);
                assert(m->ne[2] == x[0]->ne[2]);
                assert(m->ne[3] == x[0]->ne[3]);

                if (ndims <= 2) {
                    check_gradient("mul_mat", ctx0, x, f, ndims, nargs, 1e-3f, 1e-3f, INFINITY);
                } else {
                    struct ggml_cgraph * gf = ggml_new_graph(ctx0);
                    ggml_build_forward_expand(gf, m);
                    ggml_graph_compute_with_ctx(ctx0, gf, n_threads);
                }

                check_mat_mul(m, x[1], x[0]);
            }
        }
        ggml_free(ctx0);
    }

    return 0;
}